

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::tbbRadixIteration1
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,uint shift,uint *src,uint *dst,
          size_t threadIndex,size_t threadCount)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t i_4;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  size_t i_1;
  size_t sVar13;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [282];
  
  lVar3 = *(long *)(this + 0x18);
  for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 4) {
    *(undefined1 (*) [16])(local_480 + uVar8) = (undefined1  [16])0x0;
  }
  uVar8 = (lVar3 * threadIndex) / threadCount;
  lVar7 = *(long *)this;
  lVar9 = lVar7;
  for (sVar13 = 0; sVar13 != threadCount; sVar13 = sVar13 + 1) {
    for (uVar12 = 0; uVar12 < 0x100; uVar12 = uVar12 + 4) {
      piVar1 = (int *)(lVar9 + uVar12 * 4);
      iVar4 = piVar1[1];
      iVar5 = piVar1[2];
      iVar6 = piVar1[3];
      local_480[uVar12] = *piVar1 + local_480[uVar12];
      local_480[uVar12 + 1] = iVar4 + local_480[uVar12 + 1];
      local_480[uVar12 + 2] = iVar5 + local_480[uVar12 + 2];
      local_480[uVar12 + 3] = iVar6 + local_480[uVar12 + 3];
    }
    lVar9 = lVar9 + 0x400;
  }
  local_880[0] = 0;
  uVar11 = 0;
  for (lVar9 = 1; lVar9 != 0x100; lVar9 = lVar9 + 1) {
    uVar11 = uVar11 + local_880[lVar9 + 0xff];
    local_880[lVar9] = uVar11;
  }
  for (sVar13 = 0; sVar13 != threadIndex; sVar13 = sVar13 + 1) {
    for (uVar12 = 0; uVar12 < 0x100; uVar12 = uVar12 + 4) {
      piVar1 = (int *)(lVar7 + uVar12 * 4);
      iVar4 = piVar1[1];
      iVar5 = piVar1[2];
      iVar6 = piVar1[3];
      local_880[uVar12] = *piVar1 + local_880[uVar12];
      local_880[uVar12 + 1] = iVar4 + local_880[uVar12 + 1];
      local_880[uVar12 + 2] = iVar5 + local_880[uVar12 + 2];
      local_880[uVar12 + 3] = iVar6 + local_880[uVar12 + 3];
    }
    lVar7 = lVar7 + 0x400;
  }
  for (; uVar8 < ((threadIndex + 1) * lVar3) / threadCount; uVar8 = uVar8 + 1) {
    uVar11 = src[uVar8];
    bVar10 = (byte)(uVar11 >> ((byte)shift & 0x3f));
    uVar2 = local_880[bVar10];
    local_880[bVar10] = uVar2 + 1;
    dst[uVar2] = uVar11;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }